

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask24_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar2 = in[1];
  *out = uVar2 << 0x18 | uVar1;
  uVar2 = uVar2 >> 8;
  out[1] = uVar2;
  uVar1 = in[2];
  out[1] = uVar1 << 0x10 | uVar2;
  uVar1 = uVar1 >> 0x10;
  out[2] = uVar1;
  out[2] = in[3] << 8 | uVar1;
  uVar1 = in[4];
  out[3] = uVar1;
  uVar2 = in[5];
  out[3] = uVar2 << 0x18 | uVar1;
  uVar2 = uVar2 >> 8;
  out[4] = uVar2;
  uVar1 = in[6];
  out[4] = uVar1 << 0x10 | uVar2;
  uVar1 = uVar1 >> 0x10;
  out[5] = uVar1;
  out[5] = in[7] << 8 | uVar1;
  uVar1 = in[8];
  out[6] = uVar1;
  uVar2 = in[9];
  out[6] = uVar2 << 0x18 | uVar1;
  uVar2 = uVar2 >> 8;
  out[7] = uVar2;
  uVar1 = in[10];
  out[7] = uVar1 << 0x10 | uVar2;
  uVar1 = uVar1 >> 0x10;
  out[8] = uVar1;
  out[8] = in[0xb] << 8 | uVar1;
  uVar1 = in[0xc];
  out[9] = uVar1;
  uVar2 = in[0xd];
  out[9] = uVar2 << 0x18 | uVar1;
  uVar2 = uVar2 >> 8;
  out[10] = uVar2;
  uVar1 = in[0xe];
  out[10] = uVar1 << 0x10 | uVar2;
  uVar1 = uVar1 >> 0x10;
  out[0xb] = uVar1;
  out[0xb] = in[0xf] << 8 | uVar1;
  uVar1 = in[0x10];
  out[0xc] = uVar1;
  uVar2 = in[0x11];
  out[0xc] = uVar2 << 0x18 | uVar1;
  uVar2 = uVar2 >> 8;
  out[0xd] = uVar2;
  uVar1 = in[0x12];
  out[0xd] = uVar1 << 0x10 | uVar2;
  uVar1 = uVar1 >> 0x10;
  out[0xe] = uVar1;
  out[0xe] = in[0x13] << 8 | uVar1;
  uVar1 = in[0x14];
  out[0xf] = uVar1;
  uVar2 = in[0x15];
  out[0xf] = uVar2 << 0x18 | uVar1;
  uVar2 = uVar2 >> 8;
  out[0x10] = uVar2;
  uVar1 = in[0x16];
  out[0x10] = uVar1 << 0x10 | uVar2;
  uVar1 = uVar1 >> 0x10;
  out[0x11] = uVar1;
  out[0x11] = in[0x17] << 8 | uVar1;
  return out + 0x12;
}

Assistant:

uint32_t *__fastpackwithoutmask24_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (24 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (24 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (24 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (24 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (24 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (24 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (24 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (24 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (24 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (24 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (24 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (24 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  ++in;

  return out;
}